

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall slang::driver::Driver::reportDiagnostics(Driver *this,bool quiet)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  int iVar2;
  JsonWriter *this_01;
  int iVar3;
  char *in_RCX;
  char *pcVar4;
  size_t sVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar6;
  string_view sVar7;
  string_view text;
  format_args args;
  string_view contents;
  string_view fmt;
  string_view text_00;
  string_view text_01;
  string diagStr;
  string local_88;
  undefined1 local_68 [12];
  color_union local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  char *local_38;
  
  iVar2 = (this->diagEngine).numErrors;
  this_01 = (this->jsonWriter)._M_t.
            super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>._M_t.
            super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>.
            super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl;
  if (this_01 != (JsonWriter *)0x0) {
    JsonWriter::endArray(this_01);
  }
  this_00 = &(this->options).diagJson;
  if ((this->options).diagJson.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       "-");
    if (iVar3 == 0) {
      sVar7 = JsonWriter::view((this->jsonWriter)._M_t.
                               super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                               .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl);
      OS::print(sVar7);
      bVar6 = true;
      goto LAB_001dd5cc;
    }
  }
  TextDiagnosticClient::getString_abi_cxx11_
            (&local_88,
             (this->textDiagClient).
             super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar6 = 1 < local_88._M_string_length;
  sVar7._M_str = local_88._M_dataplus._M_p;
  sVar7._M_len = local_88._M_string_length;
  OS::printE(sVar7);
  if ((this->jsonWriter)._M_t.
      super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>._M_t.
      super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>.
      super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl != (JsonWriter *)0x0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               auto_format);
    sVar7 = JsonWriter::view((this->jsonWriter)._M_t.
                             super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                             .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl);
    contents._M_len = sVar7._M_str;
    contents._M_str = in_RCX;
    OS::writeFile((OS *)local_68,(path *)sVar7._M_len,contents);
    std::filesystem::__cxx11::path::~path((path *)local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_001dd5cc:
  if (!quiet) {
    if (bVar6) {
      text_00._M_str = "\n";
      text_00._M_len = 1;
      OS::print(text_00);
    }
    if (iVar2 == 0) {
      bVar1 = (((this->textDiagClient).
                super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_DiagnosticClient).field_0x1d;
      local_58._M_allocated_capacity = (ulong)(uint5)local_58._M_allocated_capacity._3_5_ << 0x18;
      pcVar4 = "Build succeeded: ";
      sVar5 = 0x11;
    }
    else {
      bVar1 = (((this->textDiagClient).
                super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_DiagnosticClient).field_0x1b;
      local_58._M_allocated_capacity = (ulong)(uint5)local_58._M_allocated_capacity._3_5_ << 0x18;
      pcVar4 = "Build failed: ";
      sVar5 = 0xe;
    }
    local_68._0_8_ = (ulong)bVar1 << 0x20;
    local_58._M_allocated_capacity._0_2_ = 1;
    local_5c.term_color = '\0';
    local_68[8] = false;
    text._M_str = pcVar4;
    text._M_len = sVar5;
    OS::print((text_style *)local_68,text);
    iVar3 = (this->diagEngine).numErrors;
    local_48 = (this->diagEngine).numWarnings;
    local_38 = "s";
    local_58._M_allocated_capacity = (size_type)"s";
    if (iVar3 == 1) {
      local_58._M_allocated_capacity = (size_type)"";
    }
    if (local_48 == 1) {
      local_38 = "";
    }
    local_68._0_4_ = iVar3;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0xc1c1;
    fmt.data_ = (char *)0x19;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"{} error{}, {} warning{}\n",fmt,args);
    text_01._M_str = local_88._M_dataplus._M_p;
    text_01._M_len = local_88._M_string_length;
    OS::print(text_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar2 == 0;
}

Assistant:

bool Driver::reportDiagnostics(bool quiet) {
    bool hasDiagsStdout = false;
    bool succeeded = diagEngine.getNumErrors() == 0;

    if (jsonWriter)
        jsonWriter->endArray();

    if (options.diagJson == "-") {
        // If we're printing JSON diagnostics to stdout don't also
        // print the text diagnostics.
        hasDiagsStdout = true;
        OS::print(jsonWriter->view());
    }
    else {
        std::string diagStr = textDiagClient->getString();
        hasDiagsStdout = diagStr.size() > 1;
        OS::printE(diagStr);

        if (jsonWriter)
            OS::writeFile(*options.diagJson, jsonWriter->view());
    }

    if (!quiet) {
        if (hasDiagsStdout)
            OS::print("\n");

        if (succeeded)
            OS::print(fg(textDiagClient->highlightColor), "Build succeeded: ");
        else
            OS::print(fg(textDiagClient->errorColor), "Build failed: ");

        OS::print(fmt::format("{} error{}, {} warning{}\n", diagEngine.getNumErrors(),
                              diagEngine.getNumErrors() == 1 ? "" : "s",
                              diagEngine.getNumWarnings(),
                              diagEngine.getNumWarnings() == 1 ? "" : "s"));
    }

    return succeeded;
}